

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  ValueRangeExpressionSyntax *pVVar1;
  ExpressionSyntax *unaff_retaddr;
  Token *in_stack_00000008;
  ExpressionSyntax *in_stack_00000010;
  Token *in_stack_00000018;
  BumpAllocator *in_stack_00000020;
  BumpAllocator *in_stack_000000f8;
  Token *in_stack_00000100;
  ExpressionSyntax *in_stack_ffffffffffffffb0;
  
  parsing::Token::deepClone(in_stack_00000100,in_stack_000000f8);
  not_null<slang::syntax::ExpressionSyntax_*>::operator*
            ((not_null<slang::syntax::ExpressionSyntax_*> *)0x7c14b2);
  deepClone<slang::syntax::ExpressionSyntax>
            (in_stack_ffffffffffffffb0,(BumpAllocator *)__child_stack);
  parsing::Token::deepClone(in_stack_00000100,in_stack_000000f8);
  not_null<slang::syntax::ExpressionSyntax_*>::operator*
            ((not_null<slang::syntax::ExpressionSyntax_*> *)0x7c14ef);
  deepClone<slang::syntax::ExpressionSyntax>
            (in_stack_ffffffffffffffb0,(BumpAllocator *)__child_stack);
  parsing::Token::deepClone(in_stack_00000100,in_stack_000000f8);
  pVVar1 = BumpAllocator::
           emplace<slang::syntax::ValueRangeExpressionSyntax,slang::parsing::Token,slang::syntax::ExpressionSyntax&,slang::parsing::Token,slang::syntax::ExpressionSyntax&,slang::parsing::Token>
                     (in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_00000008,
                      unaff_retaddr,(Token *)__fn);
  return (int)pVVar1;
}

Assistant:

static SyntaxNode* clone(const ValueRangeExpressionSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<ValueRangeExpressionSyntax>(
        node.openBracket.deepClone(alloc),
        *deepClone<ExpressionSyntax>(*node.left, alloc),
        node.op.deepClone(alloc),
        *deepClone<ExpressionSyntax>(*node.right, alloc),
        node.closeBracket.deepClone(alloc)
    );
}